

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTextureBufferActiveUniformValidation.cpp
# Opt level: O0

void __thiscall
glcts::TextureParameters::TextureParameters
          (TextureParameters *this,GLuint textureBufferSize,GLenum textureFormat,
          GLenum textureUniforType,char *uniformName)

{
  char *uniformName_local;
  GLenum textureUniforType_local;
  GLenum textureFormat_local;
  GLuint textureBufferSize_local;
  TextureParameters *this_local;
  
  std::__cxx11::string::string((string *)&this->m_uniform_name);
  this->m_texture_buffer_size = textureBufferSize;
  this->m_texture_format = textureFormat;
  this->m_texture_uniform_type = textureUniforType;
  std::__cxx11::string::operator=((string *)&this->m_uniform_name,uniformName);
  return;
}

Assistant:

TextureParameters::TextureParameters(glw::GLuint textureBufferSize, glw::GLenum textureFormat,
									 glw::GLenum textureUniforType, const char* uniformName)
{
	m_texture_buffer_size  = textureBufferSize;
	m_texture_format	   = textureFormat;
	m_texture_uniform_type = textureUniforType;
	m_uniform_name		   = uniformName;
}